

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O0

void __thiscall cmQtAutoGenerator::Logger::Error(Logger *this,GenT genType,string *message)

{
  string *__lhs;
  char *pcVar1;
  lock_guard<std::mutex> local_98;
  lock_guard<std::mutex> lock;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  undefined1 local_40 [8];
  string msg;
  string *message_local;
  GenT genType_local;
  Logger *this_local;
  
  msg.field_2._8_8_ = message;
  std::__cxx11::string::string((string *)local_40);
  __lhs = cmQtAutoGen::GeneratorName_abi_cxx11_(genType);
  std::operator+(&local_80,__lhs," error");
  HeadLine(&local_60,&local_80);
  std::__cxx11::string::operator+=((string *)local_40,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::operator+=((string *)local_40,(string *)msg.field_2._8_8_);
  pcVar1 = (char *)std::__cxx11::string::back();
  if (*pcVar1 != '\n') {
    std::__cxx11::string::push_back((char)local_40);
  }
  std::__cxx11::string::push_back((char)local_40);
  std::lock_guard<std::mutex>::lock_guard(&local_98,&this->Mutex_);
  cmSystemTools::Stderr((string *)local_40);
  std::lock_guard<std::mutex>::~lock_guard(&local_98);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmQtAutoGenerator::Logger::Error(GenT genType,
                                      std::string const& message) const
{
  std::string msg;
  msg += HeadLine(GeneratorName(genType) + " error");
  // Message
  msg += message;
  if (msg.back() != '\n') {
    msg.push_back('\n');
  }
  msg.push_back('\n');
  {
    std::lock_guard<std::mutex> lock(Mutex_);
    cmSystemTools::Stderr(msg);
  }
}